

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unaryop_x86.cpp
# Opt level: O2

int __thiscall
ncnn::UnaryOp_x86::forward_inplace(UnaryOp_x86 *this,Mat *bottom_top_blob,Option *opt)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  ulong uVar5;
  float *pfVar6;
  undefined1 (*pauVar7) [16];
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  float fVar17;
  int iVar27;
  float fVar28;
  undefined1 in_XMM0 [16];
  undefined1 auVar18 [16];
  int iVar29;
  int iVar32;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  uint uVar30;
  uint uVar31;
  uint uVar33;
  uint uVar34;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar35;
  float fVar36;
  float fVar47;
  float fVar48;
  undefined1 in_XMM1 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar49;
  float fVar50;
  undefined1 auVar46 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar74;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  
  auVar52 = _DAT_00551680;
  switch((this->super_UnaryOp).op_type) {
  case 0:
    iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar12 = 0;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar12;
    }
    for (; uVar12 != uVar5; uVar12 = uVar12 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar7 = (undefined1 (*) [16])(sVar3 * uVar12 * sVar2 + (long)pvVar1);
      lVar11 = 0;
      for (iVar10 = 0; iVar10 + 3 < iVar8; iVar10 = iVar10 + 4) {
        auVar37._0_8_ = *(ulong *)*pauVar7 & 0x7fffffff7fffffff;
        auVar37._8_4_ = *(uint *)((long)*pauVar7 + 8) & 0x7fffffff;
        auVar37._12_4_ = *(uint *)((long)*pauVar7 + 0xc) & 0x7fffffff;
        *pauVar7 = auVar37;
        pauVar7 = pauVar7 + 1;
        lVar11 = lVar11 + 4;
      }
      lVar4 = sVar3 * sVar2 * uVar12;
      for (; (int)lVar11 < iVar8; lVar11 = lVar11 + 1) {
        *(uint *)((long)pvVar1 + lVar11 * 4 + lVar4) =
             *(uint *)((long)pvVar1 + lVar11 * 4 + lVar4) & 0x7fffffff;
      }
    }
    break;
  case 1:
    iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar12 = 0;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar12;
    }
    for (; uVar12 != uVar5; uVar12 = uVar12 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar7 = (undefined1 (*) [16])(sVar3 * uVar12 * sVar2 + (long)pvVar1);
      lVar11 = 0;
      for (iVar10 = 0; iVar10 + 3 < iVar8; iVar10 = iVar10 + 4) {
        auVar44._0_8_ = *(ulong *)*pauVar7 ^ 0x8000000080000000;
        auVar44._8_4_ = *(uint *)((long)*pauVar7 + 8) ^ 0x80000000;
        auVar44._12_4_ = *(uint *)((long)*pauVar7 + 0xc) ^ 0x80000000;
        *pauVar7 = auVar44;
        pauVar7 = pauVar7 + 1;
        lVar11 = lVar11 + 4;
      }
      lVar4 = sVar3 * sVar2 * uVar12;
      for (; (int)lVar11 < iVar8; lVar11 = lVar11 + 1) {
        *(uint *)((long)pvVar1 + lVar11 * 4 + lVar4) =
             *(uint *)((long)pvVar1 + lVar11 * 4 + lVar4) ^ 0x80000000;
      }
    }
    break;
  case 2:
    iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar12 = 0;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar12;
    }
    for (; uVar12 != uVar5; uVar12 = uVar12 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar7 = (undefined1 (*) [16])(sVar3 * uVar12 * sVar2 + (long)pvVar1);
      lVar11 = 0;
      for (iVar10 = 0; iVar10 + 3 < iVar8; iVar10 = iVar10 + 4) {
        auVar52 = *pauVar7;
        fVar17 = auVar52._0_4_;
        fVar36 = auVar52._4_4_;
        fVar28 = auVar52._8_4_;
        fVar47 = auVar52._12_4_;
        uVar13 = -(uint)(ABS(fVar17) <= 8388608.0);
        uVar14 = -(uint)(ABS(fVar36) <= 8388608.0);
        uVar15 = -(uint)(ABS(fVar28) <= 8388608.0);
        uVar16 = -(uint)(ABS(fVar47) <= 8388608.0);
        fVar35 = (float)((uint)(float)(int)ABS(fVar17) | (uint)fVar17 & 0x80000000);
        fVar49 = (float)((uint)(float)(int)ABS(fVar36) | (uint)fVar36 & 0x80000000);
        fVar48 = (float)((uint)(float)(int)ABS(fVar28) | (uint)fVar28 & 0x80000000);
        fVar50 = (float)((uint)(float)(int)ABS(fVar47) | (uint)fVar47 & 0x80000000);
        auVar66._0_4_ = (uint)(fVar35 - (float)(-(uint)(fVar17 < fVar35) & 0x3f800000)) & uVar13;
        auVar66._4_4_ = (uint)(fVar49 - (float)(-(uint)(fVar36 < fVar49) & 0x3f800000)) & uVar14;
        auVar66._8_4_ = (uint)(fVar48 - (float)(-(uint)(fVar28 < fVar48) & 0x3f800000)) & uVar15;
        auVar66._12_4_ = (uint)(fVar50 - (float)(-(uint)(fVar47 < fVar50) & 0x3f800000)) & uVar16;
        auVar42._0_4_ = ~uVar13 & (uint)fVar17;
        auVar42._4_4_ = ~uVar14 & (uint)fVar36;
        auVar42._8_4_ = ~uVar15 & (uint)fVar28;
        auVar42._12_4_ = ~uVar16 & (uint)fVar47;
        *pauVar7 = auVar42 | auVar66;
        pauVar7 = pauVar7 + 1;
        lVar11 = lVar11 + 4;
      }
      lVar4 = sVar3 * sVar2 * uVar12;
      for (; (int)lVar11 < iVar8; lVar11 = lVar11 + 1) {
        fVar17 = floorf(*(float *)((long)pvVar1 + lVar11 * 4 + lVar4));
        *(float *)((long)pvVar1 + lVar11 * 4 + lVar4) = fVar17;
      }
    }
    break;
  case 3:
    iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar12 = 0;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar12;
    }
    for (; uVar12 != uVar5; uVar12 = uVar12 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar7 = (undefined1 (*) [16])(sVar3 * uVar12 * sVar2 + (long)pvVar1);
      lVar11 = 0;
      for (iVar10 = 0; iVar10 + 3 < iVar8; iVar10 = iVar10 + 4) {
        auVar52 = *pauVar7;
        fVar17 = auVar52._0_4_;
        fVar36 = auVar52._4_4_;
        fVar28 = auVar52._8_4_;
        fVar47 = auVar52._12_4_;
        uVar13 = -(uint)(ABS(fVar17) <= 8388608.0);
        uVar14 = -(uint)(ABS(fVar36) <= 8388608.0);
        uVar15 = -(uint)(ABS(fVar28) <= 8388608.0);
        uVar16 = -(uint)(ABS(fVar47) <= 8388608.0);
        fVar35 = (float)((uint)(float)(int)ABS(fVar17) | (uint)fVar17 & 0x80000000);
        fVar49 = (float)((uint)(float)(int)ABS(fVar36) | (uint)fVar36 & 0x80000000);
        fVar48 = (float)((uint)(float)(int)ABS(fVar28) | (uint)fVar28 & 0x80000000);
        fVar50 = (float)((uint)(float)(int)ABS(fVar47) | (uint)fVar47 & 0x80000000);
        auVar67._0_4_ =
             (uint)(fVar35 - (float)(-(uint)(fVar35 < fVar17 && 0.0 < fVar17) & 0xbf800000)) &
             uVar13;
        auVar67._4_4_ =
             (uint)(fVar49 - (float)(-(uint)(fVar49 < fVar36 && 0.0 < fVar36) & 0xbf800000)) &
             uVar14;
        auVar67._8_4_ =
             (uint)(fVar48 - (float)(-(uint)(fVar48 < fVar28 && 0.0 < fVar28) & 0xbf800000)) &
             uVar15;
        auVar67._12_4_ =
             (uint)(fVar50 - (float)(-(uint)(fVar50 < fVar47 && 0.0 < fVar47) & 0xbf800000)) &
             uVar16;
        auVar43._0_4_ = ~uVar13 & (uint)fVar17;
        auVar43._4_4_ = ~uVar14 & (uint)fVar36;
        auVar43._8_4_ = ~uVar15 & (uint)fVar28;
        auVar43._12_4_ = ~uVar16 & (uint)fVar47;
        *pauVar7 = auVar43 | auVar67;
        pauVar7 = pauVar7 + 1;
        lVar11 = lVar11 + 4;
      }
      lVar4 = sVar3 * sVar2 * uVar12;
      for (; (int)lVar11 < iVar8; lVar11 = lVar11 + 1) {
        fVar17 = ceilf(*(float *)((long)pvVar1 + lVar11 * 4 + lVar4));
        *(float *)((long)pvVar1 + lVar11 * 4 + lVar4) = fVar17;
      }
    }
    break;
  case 4:
    iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar12 = 0;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar12;
    }
    for (; uVar12 != uVar5; uVar12 = uVar12 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar7 = (undefined1 (*) [16])(sVar3 * uVar12 * sVar2 + (long)pvVar1);
      lVar11 = 0;
      for (iVar10 = 0; iVar10 + 3 < iVar8; iVar10 = iVar10 + 4) {
        fVar17 = *(float *)((long)*pauVar7 + 4);
        fVar36 = *(float *)((long)*pauVar7 + 8);
        fVar28 = *(float *)((long)*pauVar7 + 0xc);
        auVar20._0_4_ = *(float *)*pauVar7 * *(float *)*pauVar7;
        auVar20._4_4_ = fVar17 * fVar17;
        auVar20._8_4_ = fVar36 * fVar36;
        auVar20._12_4_ = fVar28 * fVar28;
        *pauVar7 = auVar20;
        pauVar7 = pauVar7 + 1;
        lVar11 = lVar11 + 4;
      }
      lVar4 = sVar3 * sVar2 * uVar12;
      for (; (int)lVar11 < iVar8; lVar11 = lVar11 + 1) {
        fVar17 = *(float *)((long)pvVar1 + lVar11 * 4 + lVar4);
        *(float *)((long)pvVar1 + lVar11 * 4 + lVar4) = fVar17 * fVar17;
      }
    }
    break;
  case 5:
    iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar12 = 0;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar12;
    }
    for (; uVar12 != uVar5; uVar12 = uVar12 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar7 = (undefined1 (*) [16])(sVar3 * uVar12 * sVar2 + (long)pvVar1);
      lVar11 = 0;
      for (iVar10 = 0; iVar10 + 3 < iVar8; iVar10 = iVar10 + 4) {
        in_XMM0 = sqrtps(in_XMM0,*pauVar7);
        *pauVar7 = in_XMM0;
        pauVar7 = pauVar7 + 1;
        lVar11 = lVar11 + 4;
      }
      lVar4 = sVar3 * sVar2 * uVar12;
      for (; (int)lVar11 < iVar8; lVar11 = lVar11 + 1) {
        in_XMM0._0_4_ = SQRT(*(float *)((long)pvVar1 + lVar11 * 4 + lVar4));
        *(float *)((long)pvVar1 + lVar11 * 4 + lVar4) = in_XMM0._0_4_;
      }
    }
    break;
  case 6:
    iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar12 = 0;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar12;
    }
    for (; uVar12 != uVar5; uVar12 = uVar12 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar7 = (undefined1 (*) [16])(sVar3 * uVar12 * sVar2 + (long)pvVar1);
      lVar11 = 0;
      for (iVar10 = 0; iVar10 + 3 < iVar8; iVar10 = iVar10 + 4) {
        in_XMM1 = rsqrtps(in_XMM1,*pauVar7);
        *pauVar7 = in_XMM1;
        pauVar7 = pauVar7 + 1;
        lVar11 = lVar11 + 4;
      }
      lVar4 = sVar3 * sVar2 * uVar12;
      for (; (int)lVar11 < iVar8; lVar11 = lVar11 + 1) {
        in_XMM1._0_4_ = SQRT(*(float *)((long)pvVar1 + lVar11 * 4 + lVar4));
        *(float *)((long)pvVar1 + lVar11 * 4 + lVar4) = 1.0 / in_XMM1._0_4_;
      }
    }
    break;
  case 7:
    iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar12 = 0;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar12;
    }
    for (; uVar12 != uVar5; uVar12 = uVar12 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar7 = (undefined1 (*) [16])(sVar3 * uVar12 * sVar2 + (long)pvVar1);
      lVar11 = 0;
      for (iVar10 = 0; iVar10 + 3 < iVar8; iVar10 = iVar10 + 4) {
        auVar52 = minps(*pauVar7,_DAT_00551640);
        auVar52 = maxps(auVar52,_DAT_00551650);
        fVar36 = auVar52._0_4_ * 1.442695 + (float)DAT_00551670;
        fVar47 = auVar52._4_4_ * 1.442695 + DAT_00551670._4_4_;
        fVar49 = auVar52._8_4_ * 1.442695 + DAT_00551670._8_4_;
        fVar50 = auVar52._12_4_ * 1.442695 + DAT_00551670._12_4_;
        fVar17 = (float)(int)fVar36;
        fVar28 = (float)(int)fVar47;
        fVar35 = (float)(int)fVar49;
        fVar48 = (float)(int)fVar50;
        fVar74 = (float)DAT_00551680;
        fVar77 = DAT_00551680._4_4_;
        fVar78 = DAT_00551680._8_4_;
        fVar80 = DAT_00551680._12_4_;
        fVar17 = fVar17 - (float)(-(uint)(fVar36 < fVar17) & (uint)fVar74);
        fVar28 = fVar28 - (float)(-(uint)(fVar47 < fVar28) & (uint)fVar77);
        fVar35 = fVar35 - (float)(-(uint)(fVar49 < fVar35) & (uint)fVar78);
        fVar48 = fVar48 - (float)(-(uint)(fVar50 < fVar48) & (uint)fVar80);
        fVar36 = fVar17 * -0.6931472 + auVar52._0_4_;
        fVar47 = fVar28 * -0.6931472 + auVar52._4_4_;
        fVar49 = fVar35 * -0.6931472 + auVar52._8_4_;
        fVar50 = fVar48 * -0.6931472 + auVar52._12_4_;
        auVar56._0_4_ =
             (float)((int)fVar17 * 0x800000 + (int)fVar74) *
             (fVar36 + fVar74 +
             (((((fVar36 * 0.00019875691 + 0.0013981999) * fVar36 + 0.008333452) * fVar36 +
               0.041665796) * fVar36 + 0.16666666) * fVar36 + (float)DAT_00551670) * fVar36 * fVar36
             );
        auVar56._4_4_ =
             (float)((int)fVar28 * 0x800000 + (int)fVar77) *
             (fVar47 + fVar77 +
             (((((fVar47 * 0.00019875691 + 0.0013981999) * fVar47 + 0.008333452) * fVar47 +
               0.041665796) * fVar47 + 0.16666666) * fVar47 + DAT_00551670._4_4_) * fVar47 * fVar47)
        ;
        auVar56._8_4_ =
             (float)((int)fVar35 * 0x800000 + (int)fVar78) *
             (fVar49 + fVar78 +
             (((((fVar49 * 0.00019875691 + 0.0013981999) * fVar49 + 0.008333452) * fVar49 +
               0.041665796) * fVar49 + 0.16666666) * fVar49 + DAT_00551670._8_4_) * fVar49 * fVar49)
        ;
        auVar56._12_4_ =
             (float)((int)fVar48 * 0x800000 + (int)fVar80) *
             (fVar50 + fVar80 +
             (((((fVar50 * 0.00019875691 + 0.0013981999) * fVar50 + 0.008333452) * fVar50 +
               0.041665796) * fVar50 + 0.16666666) * fVar50 + DAT_00551670._12_4_) * fVar50 * fVar50
             );
        *pauVar7 = auVar56;
        pauVar7 = pauVar7 + 1;
        lVar11 = lVar11 + 4;
      }
      lVar4 = sVar3 * sVar2 * uVar12;
      for (; (int)lVar11 < iVar8; lVar11 = lVar11 + 1) {
        fVar17 = expf(*(float *)((long)pvVar1 + lVar11 * 4 + lVar4));
        *(float *)((long)pvVar1 + lVar11 * 4 + lVar4) = fVar17;
      }
    }
    break;
  case 8:
    iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar12 = 0;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar12;
    }
    for (; uVar12 != uVar5; uVar12 = uVar12 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar7 = (undefined1 (*) [16])(sVar3 * uVar12 * sVar2 + (long)pvVar1);
      lVar11 = 0;
      for (iVar10 = 0; iVar10 + 3 < iVar8; iVar10 = iVar10 + 4) {
        auVar52 = *pauVar7;
        auVar55 = maxps(auVar52,_DAT_005516f0);
        fVar17 = (float)(auVar55._0_4_ & 0x807fffff | 0x3f000000);
        fVar28 = (float)(auVar55._4_4_ & 0x807fffff | 0x3f000000);
        fVar35 = (float)(auVar55._8_4_ & 0x807fffff | 0x3f000000);
        fVar48 = (float)(auVar55._12_4_ & 0x807fffff | 0x3f000000);
        fVar36 = fVar17 + -1.0 + (float)(-(uint)(fVar17 < 0.70710677) & (uint)fVar17);
        fVar47 = fVar28 + -1.0 + (float)(-(uint)(fVar28 < 0.70710677) & (uint)fVar28);
        fVar49 = fVar35 + -1.0 + (float)(-(uint)(fVar35 < 0.70710677) & (uint)fVar35);
        fVar50 = fVar48 + -1.0 + (float)(-(uint)(fVar48 < 0.70710677) & (uint)fVar48);
        auVar62._0_4_ =
             ((float)(int)((auVar55._0_4_ >> 0x17) - 0x7e) -
             (float)(-(uint)(fVar17 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar36 +
             (((((((((fVar36 * 0.070376836 + -0.1151461) * fVar36 + 0.116769984) * fVar36 +
                   -0.12420141) * fVar36 + 0.14249323) * fVar36 + -0.16668057) * fVar36 + 0.20000714
                ) * fVar36 + -0.24999994) * fVar36 + 0.3333333) * fVar36 + -0.5) * fVar36 * fVar36;
        auVar62._4_4_ =
             ((float)(int)((auVar55._4_4_ >> 0x17) - 0x7e) -
             (float)(-(uint)(fVar28 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar47 +
             (((((((((fVar47 * 0.070376836 + -0.1151461) * fVar47 + 0.116769984) * fVar47 +
                   -0.12420141) * fVar47 + 0.14249323) * fVar47 + -0.16668057) * fVar47 + 0.20000714
                ) * fVar47 + -0.24999994) * fVar47 + 0.3333333) * fVar47 + -0.5) * fVar47 * fVar47;
        auVar62._8_4_ =
             ((float)(int)((auVar55._8_4_ >> 0x17) - 0x7e) -
             (float)(-(uint)(fVar35 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar49 +
             (((((((((fVar49 * 0.070376836 + -0.1151461) * fVar49 + 0.116769984) * fVar49 +
                   -0.12420141) * fVar49 + 0.14249323) * fVar49 + -0.16668057) * fVar49 + 0.20000714
                ) * fVar49 + -0.24999994) * fVar49 + 0.3333333) * fVar49 + -0.5) * fVar49 * fVar49;
        auVar62._12_4_ =
             ((float)(int)((auVar55._12_4_ >> 0x17) - 0x7e) -
             (float)(-(uint)(fVar48 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar50 +
             (((((((((fVar50 * 0.070376836 + -0.1151461) * fVar50 + 0.116769984) * fVar50 +
                   -0.12420141) * fVar50 + 0.14249323) * fVar50 + -0.16668057) * fVar50 + 0.20000714
                ) * fVar50 + -0.24999994) * fVar50 + 0.3333333) * fVar50 + -0.5) * fVar50 * fVar50;
        auVar26._4_4_ = -(uint)(auVar52._4_4_ <= 0.0);
        auVar26._0_4_ = -(uint)(auVar52._0_4_ <= 0.0);
        auVar26._8_4_ = -(uint)(auVar52._8_4_ <= 0.0);
        auVar26._12_4_ = -(uint)(auVar52._12_4_ <= 0.0);
        *pauVar7 = auVar62 | auVar26;
        pauVar7 = pauVar7 + 1;
        lVar11 = lVar11 + 4;
      }
      lVar4 = sVar3 * sVar2 * uVar12;
      for (; (int)lVar11 < iVar8; lVar11 = lVar11 + 1) {
        fVar17 = logf(*(float *)((long)pvVar1 + lVar11 * 4 + lVar4));
        *(float *)((long)pvVar1 + lVar11 * 4 + lVar4) = fVar17;
      }
    }
    break;
  case 9:
    iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar12 = 0;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar12;
    }
    for (; uVar12 != uVar5; uVar12 = uVar12 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar7 = (undefined1 (*) [16])(sVar3 * uVar12 * sVar2 + (long)pvVar1);
      lVar11 = 0;
      for (iVar10 = 0; iVar10 + 3 < iVar8; iVar10 = iVar10 + 4) {
        fVar17 = *(float *)((long)*pauVar7 + 4);
        fVar36 = *(float *)((long)*pauVar7 + 8);
        fVar28 = *(float *)((long)*pauVar7 + 0xc);
        fVar47 = ABS(*(float *)*pauVar7);
        fVar35 = ABS(fVar17);
        fVar49 = ABS(fVar36);
        fVar48 = ABS(fVar28);
        uVar13 = (int)(fVar47 * 1.2732395) + 1;
        uVar15 = (int)(fVar35 * 1.2732395) + 1;
        uVar30 = (int)(fVar49 * 1.2732395) + 1;
        uVar33 = (int)(fVar48 * 1.2732395) + 1;
        fVar47 = (float)(int)(uVar13 & 0xfffffffe) * -0.7853982 + fVar47;
        fVar35 = (float)(int)(uVar15 & 0xfffffffe) * -0.7853982 + fVar35;
        fVar49 = (float)(int)(uVar30 & 0xfffffffe) * -0.7853982 + fVar49;
        fVar48 = (float)(int)(uVar33 & 0xfffffffe) * -0.7853982 + fVar48;
        fVar50 = fVar47 * fVar47;
        fVar74 = fVar35 * fVar35;
        fVar77 = fVar49 * fVar49;
        fVar78 = fVar48 * fVar48;
        uVar14 = -(uint)((uVar13 & 2) == 0);
        uVar16 = -(uint)((uVar15 & 2) == 0);
        uVar31 = -(uint)((uVar30 & 2) == 0);
        uVar34 = -(uint)((uVar33 & 2) == 0);
        auVar65._0_4_ =
             (uint)(fVar50 * fVar47 *
                    ((fVar50 * -0.00019515296 + 0.008332161) * fVar50 + -0.16666655) + fVar47) &
             uVar14;
        auVar65._4_4_ =
             (uint)(fVar74 * fVar35 *
                    ((fVar74 * -0.00019515296 + 0.008332161) * fVar74 + -0.16666655) + fVar35) &
             uVar16;
        auVar65._8_4_ =
             (uint)(fVar77 * fVar49 *
                    ((fVar77 * -0.00019515296 + 0.008332161) * fVar77 + -0.16666655) + fVar49) &
             uVar31;
        auVar65._12_4_ =
             (uint)(fVar78 * fVar48 *
                    ((fVar78 * -0.00019515296 + 0.008332161) * fVar78 + -0.16666655) + fVar48) &
             uVar34;
        auVar22._0_4_ =
             ~uVar14 & (uint)((((fVar50 * 2.4433157e-05 + -0.0013887316) * fVar50 + 0.041666646) *
                               fVar50 + -0.5) * fVar50 + 1.0);
        auVar22._4_4_ =
             ~uVar16 & (uint)((((fVar74 * 2.4433157e-05 + -0.0013887316) * fVar74 + 0.041666646) *
                               fVar74 + -0.5) * fVar74 + 1.0);
        auVar22._8_4_ =
             ~uVar31 & (uint)((((fVar77 * 2.4433157e-05 + -0.0013887316) * fVar77 + 0.041666646) *
                               fVar77 + -0.5) * fVar77 + 1.0);
        auVar22._12_4_ =
             ~uVar34 & (uint)((((fVar78 * 2.4433157e-05 + -0.0013887316) * fVar78 + 0.041666646) *
                               fVar78 + -0.5) * fVar78 + 1.0);
        auVar22 = auVar22 | auVar65;
        auVar23._0_4_ =
             auVar22._0_4_ ^ (uVar13 * 0x20000000 ^ (uint)*(float *)*pauVar7) & 0x80000000;
        auVar23._4_4_ = auVar22._4_4_ ^ (uVar15 * 0x20000000 ^ (uint)fVar17) & 0x80000000;
        auVar23._8_4_ = auVar22._8_4_ ^ (uVar30 * 0x20000000 ^ (uint)fVar36) & 0x80000000;
        auVar23._12_4_ = auVar22._12_4_ ^ (uVar33 * 0x20000000 ^ (uint)fVar28) & 0x80000000;
        *pauVar7 = auVar23;
        pauVar7 = pauVar7 + 1;
        lVar11 = lVar11 + 4;
      }
      lVar4 = sVar3 * sVar2 * uVar12;
      for (; (int)lVar11 < iVar8; lVar11 = lVar11 + 1) {
        fVar17 = sinf(*(float *)((long)pvVar1 + lVar11 * 4 + lVar4));
        *(float *)((long)pvVar1 + lVar11 * 4 + lVar4) = fVar17;
      }
    }
    break;
  case 10:
    iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar12 = 0;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar12;
    }
    for (; uVar12 != uVar5; uVar12 = uVar12 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar7 = (undefined1 (*) [16])(sVar3 * uVar12 * sVar2 + (long)pvVar1);
      lVar11 = 0;
      for (iVar10 = 0; iVar10 + 3 < iVar8; iVar10 = iVar10 + 4) {
        fVar36 = ABS(*(float *)((long)*pauVar7 + 4));
        fVar28 = ABS(*(float *)((long)*pauVar7 + 8));
        fVar47 = ABS(*(float *)((long)*pauVar7 + 0xc));
        uVar13 = (int)(ABS(*(float *)*pauVar7) * 1.2732395) + 1U & 0xfffffffe;
        uVar15 = (int)(fVar36 * 1.2732395) + 1U & 0xfffffffe;
        uVar30 = (int)(fVar28 * 1.2732395) + 1U & 0xfffffffe;
        uVar33 = (int)(fVar47 * 1.2732395) + 1U & 0xfffffffe;
        fVar17 = (float)(int)uVar13 * -0.7853982 + ABS(*(float *)*pauVar7);
        fVar36 = (float)(int)uVar15 * -0.7853982 + fVar36;
        fVar28 = (float)(int)uVar30 * -0.7853982 + fVar28;
        fVar47 = (float)(int)uVar33 * -0.7853982 + fVar47;
        fVar35 = fVar17 * fVar17;
        fVar49 = fVar36 * fVar36;
        fVar48 = fVar28 * fVar28;
        fVar50 = fVar47 * fVar47;
        uVar13 = uVar13 - 2;
        uVar15 = uVar15 - 2;
        uVar30 = uVar30 - 2;
        uVar33 = uVar33 - 2;
        uVar14 = -(uint)((uVar13 & 2) == 0);
        uVar16 = -(uint)((uVar15 & 2) == 0);
        uVar31 = -(uint)((uVar30 & 2) == 0);
        uVar34 = -(uint)((uVar33 & 2) == 0);
        auVar61._0_4_ =
             (uint)(fVar35 * fVar17 *
                    ((fVar35 * -0.00019515296 + 0.008332161) * fVar35 + -0.16666655) + fVar17) &
             uVar14;
        auVar61._4_4_ =
             (uint)(fVar49 * fVar36 *
                    ((fVar49 * -0.00019515296 + 0.008332161) * fVar49 + -0.16666655) + fVar36) &
             uVar16;
        auVar61._8_4_ =
             (uint)(fVar48 * fVar28 *
                    ((fVar48 * -0.00019515296 + 0.008332161) * fVar48 + -0.16666655) + fVar28) &
             uVar31;
        auVar61._12_4_ =
             (uint)(fVar50 * fVar47 *
                    ((fVar50 * -0.00019515296 + 0.008332161) * fVar50 + -0.16666655) + fVar47) &
             uVar34;
        auVar25._0_4_ =
             ~uVar14 & (uint)((((fVar35 * 2.4433157e-05 + -0.0013887316) * fVar35 + 0.041666646) *
                               fVar35 + -0.5) * fVar35 + 1.0);
        auVar25._4_4_ =
             ~uVar16 & (uint)((((fVar49 * 2.4433157e-05 + -0.0013887316) * fVar49 + 0.041666646) *
                               fVar49 + -0.5) * fVar49 + 1.0);
        auVar25._8_4_ =
             ~uVar31 & (uint)((((fVar48 * 2.4433157e-05 + -0.0013887316) * fVar48 + 0.041666646) *
                               fVar48 + -0.5) * fVar48 + 1.0);
        auVar25._12_4_ =
             ~uVar34 & (uint)((((fVar50 * 2.4433157e-05 + -0.0013887316) * fVar50 + 0.041666646) *
                               fVar50 + -0.5) * fVar50 + 1.0);
        auVar46._0_4_ = uVar13 * 0x20000000;
        auVar46._4_4_ = uVar15 * 0x20000000;
        auVar46._8_4_ = uVar30 * 0x20000000;
        auVar46._12_4_ = uVar33 * 0x20000000;
        *pauVar7 = auVar46 & _DAT_0054d080 ^ _DAT_0054d080 ^ (auVar25 | auVar61);
        pauVar7 = pauVar7 + 1;
        lVar11 = lVar11 + 4;
      }
      lVar4 = sVar3 * sVar2 * uVar12;
      for (; (int)lVar11 < iVar8; lVar11 = lVar11 + 1) {
        fVar17 = cosf(*(float *)((long)pvVar1 + lVar11 * 4 + lVar4));
        *(float *)((long)pvVar1 + lVar11 * 4 + lVar4) = fVar17;
      }
    }
    break;
  case 0xb:
    iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar12 = 0;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar12;
    }
    for (; uVar12 != uVar5; uVar12 = uVar12 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar7 = (undefined1 (*) [16])(sVar3 * uVar12 * sVar2 + (long)pvVar1);
      lVar11 = 0;
      for (iVar10 = 0; iVar10 + 3 < iVar8; iVar10 = iVar10 + 4) {
        auVar52 = *pauVar7;
        iVar9 = (int)(ABS(auVar52._0_4_) * 1.2732395);
        iVar27 = (int)(ABS(auVar52._4_4_) * 1.2732395);
        iVar29 = (int)(ABS(auVar52._8_4_) * 1.2732395);
        iVar32 = (int)(ABS(auVar52._12_4_) * 1.2732395);
        uVar13 = iVar9 + 1;
        uVar14 = iVar27 + 1;
        uVar15 = iVar29 + 1;
        uVar16 = iVar32 + 1;
        auVar54._0_4_ = uVar13 * 0x20000000;
        auVar54._4_4_ = uVar14 * 0x20000000;
        auVar54._8_4_ = uVar15 * 0x20000000;
        auVar54._12_4_ = uVar16 * 0x20000000;
        auVar40._0_4_ = -(uint)((uVar13 & 2) == 0);
        auVar40._4_4_ = -(uint)((uVar14 & 2) == 0);
        auVar40._8_4_ = -(uint)((uVar15 & 2) == 0);
        auVar40._12_4_ = -(uint)((uVar16 & 2) == 0);
        fVar17 = (float)(int)(uVar13 & 0xfffffffe) * -0.7853982 + ABS(auVar52._0_4_);
        fVar36 = (float)(int)(uVar14 & 0xfffffffe) * -0.7853982 + ABS(auVar52._4_4_);
        fVar28 = (float)(int)(uVar15 & 0xfffffffe) * -0.7853982 + ABS(auVar52._8_4_);
        fVar47 = (float)(int)(uVar16 & 0xfffffffe) * -0.7853982 + ABS(auVar52._12_4_);
        fVar35 = fVar17 * fVar17;
        fVar49 = fVar36 * fVar36;
        fVar48 = fVar28 * fVar28;
        fVar50 = fVar47 * fVar47;
        auVar75._0_4_ =
             fVar35 * -0.5 +
             fVar35 * fVar35 * ((fVar35 * 2.4433157e-05 + -0.0013887316) * fVar35 + 0.041666646) +
             1.0;
        auVar75._4_4_ =
             fVar49 * -0.5 +
             fVar49 * fVar49 * ((fVar49 * 2.4433157e-05 + -0.0013887316) * fVar49 + 0.041666646) +
             1.0;
        auVar75._8_4_ =
             fVar48 * -0.5 +
             fVar48 * fVar48 * ((fVar48 * 2.4433157e-05 + -0.0013887316) * fVar48 + 0.041666646) +
             1.0;
        auVar75._12_4_ =
             fVar50 * -0.5 +
             fVar50 * fVar50 * ((fVar50 * 2.4433157e-05 + -0.0013887316) * fVar50 + 0.041666646) +
             1.0;
        auVar71._0_4_ =
             fVar35 * fVar17 * ((fVar35 * -0.00019515296 + 0.008332161) * fVar35 + -0.16666655) +
             fVar17;
        auVar71._4_4_ =
             fVar49 * fVar36 * ((fVar49 * -0.00019515296 + 0.008332161) * fVar49 + -0.16666655) +
             fVar36;
        auVar71._8_4_ =
             fVar48 * fVar28 * ((fVar48 * -0.00019515296 + 0.008332161) * fVar48 + -0.16666655) +
             fVar28;
        auVar71._12_4_ =
             fVar50 * fVar47 * ((fVar50 * -0.00019515296 + 0.008332161) * fVar50 + -0.16666655) +
             fVar47;
        auVar19._0_4_ = iVar9 * 0x20000000 + -0x20000000;
        auVar19._4_4_ = iVar27 * 0x20000000 + -0x20000000;
        auVar19._8_4_ = iVar29 * 0x20000000 + -0x20000000;
        auVar19._12_4_ = iVar32 * 0x20000000 + -0x20000000;
        auVar55 = auVar19 & _DAT_0054d080 ^ (auVar75 & auVar40 | ~auVar40 & auVar71);
        auVar45 = auVar55 ^ _DAT_0054d080;
        auVar41._0_4_ = (float)(-(uint)(auVar45._0_4_ == 0.0) & 0x322bcc77) - auVar55._0_4_;
        auVar41._4_4_ = (float)(-(uint)(auVar45._4_4_ == 0.0) & 0x322bcc77) - auVar55._4_4_;
        auVar41._8_4_ = (float)(-(uint)(auVar45._8_4_ == 0.0) & 0x322bcc77) - auVar55._8_4_;
        auVar41._12_4_ = (float)(-(uint)(auVar45._12_4_ == 0.0) & 0x322bcc77) - auVar55._12_4_;
        auVar52 = divps((~auVar40 & auVar75 | auVar71 & auVar40) ^
                        (auVar54 ^ auVar52) & _DAT_0054d080,auVar41);
        *pauVar7 = auVar52;
        pauVar7 = pauVar7 + 1;
        lVar11 = lVar11 + 4;
      }
      lVar4 = sVar3 * sVar2 * uVar12;
      for (; (int)lVar11 < iVar8; lVar11 = lVar11 + 1) {
        fVar17 = tanf(*(float *)((long)pvVar1 + lVar11 * 4 + lVar4));
        *(float *)((long)pvVar1 + lVar11 * 4 + lVar4) = fVar17;
      }
    }
    break;
  case 0xc:
    iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar12 = 0;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar12;
    }
    for (; uVar12 != uVar5; uVar12 = uVar12 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar7 = (undefined1 (*) [16])(sVar3 * uVar12 * sVar2 + (long)pvVar1);
      lVar11 = 0;
      for (iVar10 = 0; iVar10 + 3 < iVar8; iVar10 = iVar10 + 4) {
        fVar17 = *(float *)((long)*pauVar7 + 8);
        fVar36 = *(float *)((long)*pauVar7 + 0xc);
        fVar28 = ABS(*(float *)*pauVar7);
        fVar47 = ABS(*(float *)((long)*pauVar7 + 4));
        fVar49 = ABS(fVar17);
        fVar50 = ABS(fVar36);
        uVar13 = -(uint)(0.5 < fVar28);
        uVar14 = -(uint)(0.5 < fVar47);
        uVar15 = -(uint)(0.5 < fVar49);
        uVar16 = -(uint)(0.5 < fVar50);
        fVar82 = (float)DAT_00551680;
        fVar83 = DAT_00551680._4_4_;
        fVar84 = DAT_00551680._8_4_;
        fVar85 = DAT_00551680._12_4_;
        auVar72._0_4_ = fVar28 * 0.5;
        auVar72._4_4_ = fVar47 * 0.5;
        auVar72._8_4_ = fVar49 * 0.5;
        auVar72._12_4_ = fVar50 * 0.5;
        auVar76._0_4_ = 0.5 - auVar72._0_4_;
        auVar76._4_4_ = 0.5 - auVar72._4_4_;
        auVar76._8_4_ = 0.5 - auVar72._8_4_;
        auVar76._12_4_ = 0.5 - auVar72._12_4_;
        auVar52 = sqrtps(auVar72,auVar76);
        fVar28 = (float)(~uVar13 & (uint)fVar28 | auVar52._0_4_ & uVar13);
        fVar35 = (float)(~uVar14 & (uint)fVar47 | auVar52._4_4_ & uVar14);
        fVar48 = (float)(~uVar15 & (uint)fVar49 | auVar52._8_4_ & uVar15);
        fVar74 = (float)(~uVar16 & (uint)fVar50 | auVar52._12_4_ & uVar16);
        fVar47 = fVar28 * fVar28;
        fVar49 = fVar35 * fVar35;
        fVar50 = fVar48 * fVar48;
        fVar77 = fVar74 * fVar74;
        fVar78 = fVar47 * fVar47;
        fVar80 = fVar49 * fVar49;
        fVar79 = fVar50 * fVar50;
        fVar81 = fVar77 * fVar77;
        auVar64._0_4_ =
             ((float)(uVar13 & (uint)fVar82) * -3.0 + fVar82) * fVar28 *
             (((fVar78 * 0.042417344 + 0.045520633) * fVar78 + 0.16666782) * fVar47 +
             (fVar78 * 0.023994016 + 0.07494697) * fVar78 + fVar82) +
             (float)(uVar13 & (uint)fVar82) * 1.5707964;
        auVar64._4_4_ =
             ((float)(uVar14 & (uint)fVar83) * -3.0 + fVar83) * fVar35 *
             (((fVar80 * 0.042417344 + 0.045520633) * fVar80 + 0.16666782) * fVar49 +
             (fVar80 * 0.023994016 + 0.07494697) * fVar80 + fVar83) +
             (float)(uVar14 & (uint)fVar83) * 1.5707964;
        auVar64._8_4_ =
             ((float)(uVar15 & (uint)fVar84) * -3.0 + fVar84) * fVar48 *
             (((fVar79 * 0.042417344 + 0.045520633) * fVar79 + 0.16666782) * fVar50 +
             (fVar79 * 0.023994016 + 0.07494697) * fVar79 + fVar84) +
             (float)(uVar15 & (uint)fVar84) * 1.5707964;
        auVar64._12_4_ =
             ((float)(uVar16 & (uint)fVar85) * -3.0 + fVar85) * fVar74 *
             (((fVar81 * 0.042417344 + 0.045520633) * fVar81 + 0.16666782) * fVar77 +
             (fVar81 * 0.023994016 + 0.07494697) * fVar81 + fVar85) +
             (float)(uVar16 & (uint)fVar85) * 1.5707964;
        auVar21._0_8_ = *(ulong *)*pauVar7 & 0x8000000080000000;
        auVar21._8_4_ = (uint)fVar17 & 0x80000000;
        auVar21._12_4_ = (uint)fVar36 & 0x80000000;
        *pauVar7 = auVar64 | auVar21;
        pauVar7 = pauVar7 + 1;
        lVar11 = lVar11 + 4;
      }
      lVar4 = sVar3 * sVar2 * uVar12;
      for (; (int)lVar11 < iVar8; lVar11 = lVar11 + 1) {
        fVar17 = asinf(*(float *)((long)pvVar1 + lVar11 * 4 + lVar4));
        *(float *)((long)pvVar1 + lVar11 * 4 + lVar4) = fVar17;
      }
    }
    break;
  case 0xd:
    iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar12 = 0;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar12;
    }
    for (; uVar12 != uVar5; uVar12 = uVar12 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar7 = (undefined1 (*) [16])(sVar3 * uVar12 * sVar2 + (long)pvVar1);
      lVar11 = 0;
      for (iVar10 = 0; iVar10 + 3 < iVar8; iVar10 = iVar10 + 4) {
        fVar17 = *(float *)((long)*pauVar7 + 4);
        fVar36 = *(float *)((long)*pauVar7 + 8);
        fVar28 = *(float *)((long)*pauVar7 + 0xc);
        fVar47 = ABS(*(float *)*pauVar7);
        fVar35 = ABS(fVar17);
        fVar49 = ABS(fVar36);
        fVar48 = ABS(fVar28);
        uVar13 = -(uint)(0.5 < fVar47);
        uVar14 = -(uint)(0.5 < fVar35);
        uVar15 = -(uint)(0.5 < fVar49);
        uVar16 = -(uint)(0.5 < fVar48);
        auVar68._0_4_ = 0.5 - fVar47 * 0.5;
        auVar68._4_4_ = 0.5 - fVar35 * 0.5;
        auVar68._8_4_ = 0.5 - fVar49 * 0.5;
        auVar68._12_4_ = 0.5 - fVar48 * 0.5;
        auVar52 = sqrtps(auVar68,auVar68);
        fVar47 = (float)(auVar52._0_4_ & uVar13 | ~uVar13 & (uint)fVar47);
        fVar35 = (float)(auVar52._4_4_ & uVar14 | ~uVar14 & (uint)fVar35);
        fVar49 = (float)(auVar52._8_4_ & uVar15 | ~uVar15 & (uint)fVar49);
        fVar48 = (float)(auVar52._12_4_ & uVar16 | ~uVar16 & (uint)fVar48);
        fVar50 = fVar47 * fVar47;
        fVar74 = fVar35 * fVar35;
        fVar77 = fVar49 * fVar49;
        fVar78 = fVar48 * fVar48;
        fVar80 = fVar50 * fVar50;
        fVar79 = fVar74 * fVar74;
        fVar81 = fVar77 * fVar77;
        fVar82 = fVar78 * fVar78;
        auVar73._0_8_ = *(ulong *)*pauVar7 & 0x8000000080000000;
        auVar73._8_4_ = (uint)fVar36 & 0x80000000;
        auVar73._12_4_ = (uint)fVar28 & 0x80000000;
        auVar58._0_4_ =
             (((fVar80 * 0.042417344 + 0.045520633) * fVar80 + 0.16666782) * fVar50 +
             (fVar80 * 0.023994016 + 0.07494697) * fVar80 + 1.0) * fVar47;
        auVar58._4_4_ =
             (((fVar79 * 0.042417344 + 0.045520633) * fVar79 + 0.16666782) * fVar74 +
             (fVar79 * 0.023994016 + 0.07494697) * fVar79 + 1.0) * fVar35;
        auVar58._8_4_ =
             (((fVar81 * 0.042417344 + 0.045520633) * fVar81 + 0.16666782) * fVar77 +
             (fVar81 * 0.023994016 + 0.07494697) * fVar81 + 1.0) * fVar49;
        auVar58._12_4_ =
             (((fVar82 * 0.042417344 + 0.045520633) * fVar82 + 0.16666782) * fVar78 +
             (fVar82 * 0.023994016 + 0.07494697) * fVar82 + 1.0) * fVar48;
        auVar69._8_4_ = auVar73._8_4_;
        auVar69._0_8_ = auVar73._0_8_;
        auVar69._12_4_ = auVar73._12_4_;
        auVar69 = auVar69 | auVar58;
        auVar59._0_4_ = auVar58._0_4_ + auVar58._0_4_;
        auVar59._4_4_ = auVar58._4_4_ + auVar58._4_4_;
        auVar59._8_4_ = auVar58._8_4_ + auVar58._8_4_;
        auVar59._12_4_ = auVar58._12_4_ + auVar58._12_4_;
        auVar59 = auVar59 | auVar73;
        auVar60._0_4_ =
             (uint)(auVar59._0_4_ + (float)(-(uint)(*(float *)*pauVar7 < 0.0) & 0x40490fdb)) &
             uVar13;
        auVar60._4_4_ = (uint)(auVar59._4_4_ + (float)(-(uint)(fVar17 < 0.0) & 0x40490fdb)) & uVar14
        ;
        auVar60._8_4_ = (uint)(auVar59._8_4_ + (float)(-(uint)(fVar36 < 0.0) & 0x40490fdb)) & uVar15
        ;
        auVar60._12_4_ =
             (uint)(auVar59._12_4_ + (float)(-(uint)(fVar28 < 0.0) & 0x40490fdb)) & uVar16;
        auVar24._0_4_ = ~uVar13 & (uint)(1.5707964 - auVar69._0_4_);
        auVar24._4_4_ = ~uVar14 & (uint)(1.5707964 - auVar69._4_4_);
        auVar24._8_4_ = ~uVar15 & (uint)(1.5707964 - auVar69._8_4_);
        auVar24._12_4_ = ~uVar16 & (uint)(1.5707964 - auVar69._12_4_);
        *pauVar7 = auVar24 | auVar60;
        pauVar7 = pauVar7 + 1;
        lVar11 = lVar11 + 4;
      }
      lVar4 = sVar3 * sVar2 * uVar12;
      for (; (int)lVar11 < iVar8; lVar11 = lVar11 + 1) {
        fVar17 = acosf(*(float *)((long)pvVar1 + lVar11 * 4 + lVar4));
        *(float *)((long)pvVar1 + lVar11 * 4 + lVar4) = fVar17;
      }
    }
    break;
  case 0xe:
    iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar12 = 0;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar12;
    }
    for (; uVar12 != uVar5; uVar12 = uVar12 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar7 = (undefined1 (*) [16])(sVar3 * uVar12 * sVar2 + (long)pvVar1);
      lVar11 = 0;
      for (iVar10 = 0; iVar10 + 3 < iVar8; iVar10 = iVar10 + 4) {
        fVar17 = *(float *)((long)*pauVar7 + 8);
        fVar36 = *(float *)((long)*pauVar7 + 0xc);
        fVar28 = ABS(*(float *)((long)*pauVar7 + 4));
        auVar63._0_8_ = *(ulong *)*pauVar7 & 0x7fffffff7fffffff;
        auVar63._8_4_ = ABS(fVar17);
        auVar63._12_4_ = ABS(fVar36);
        uVar13 = -(uint)((float)DAT_00551680 < ABS(*(float *)*pauVar7));
        uVar14 = -(uint)(DAT_00551680._4_4_ < fVar28);
        uVar15 = -(uint)(DAT_00551680._8_4_ < auVar63._8_4_);
        uVar16 = -(uint)(DAT_00551680._12_4_ < auVar63._12_4_);
        auVar70._0_4_ = ~uVar13 & (uint)ABS(*(float *)*pauVar7);
        auVar70._4_4_ = ~uVar14 & (uint)fVar28;
        auVar70._8_4_ = ~uVar15 & (uint)auVar63._8_4_;
        auVar70._12_4_ = ~uVar16 & (uint)auVar63._12_4_;
        auVar53._0_8_ = CONCAT44(uVar14,uVar13) & 0xbf800000bf800000;
        auVar53._8_4_ = uVar15 & 0xbf800000;
        auVar53._12_4_ = uVar16 & 0xbf800000;
        auVar52 = maxps(auVar63,_DAT_00551680);
        auVar52 = divps(auVar53 | auVar70,auVar52);
        fVar28 = auVar52._0_4_;
        fVar47 = auVar52._4_4_;
        fVar35 = auVar52._8_4_;
        fVar49 = auVar52._12_4_;
        fVar48 = fVar28 * fVar28;
        fVar50 = fVar47 * fVar47;
        fVar74 = fVar35 * fVar35;
        fVar77 = fVar49 * fVar49;
        fVar78 = fVar48 * fVar48;
        fVar80 = fVar50 * fVar50;
        fVar79 = fVar74 * fVar74;
        fVar81 = fVar77 * fVar77;
        auVar39._0_4_ =
             (float)(uVar13 & 0x3fc90fdb) +
             ((((fVar78 * -0.01606863 + -0.07504295) * fVar78 + -0.14203644) * fVar78 + -0.33333072)
              * fVar48 +
             (((fVar78 * 0.0028498897 + 0.04269152) * fVar78 + 0.10640934) * fVar78 + 0.1999262) *
             fVar78 + (float)DAT_00551680) * fVar28;
        auVar39._4_4_ =
             (float)(uVar14 & 0x3fc90fdb) +
             ((((fVar80 * -0.01606863 + -0.07504295) * fVar80 + -0.14203644) * fVar80 + -0.33333072)
              * fVar50 +
             (((fVar80 * 0.0028498897 + 0.04269152) * fVar80 + 0.10640934) * fVar80 + 0.1999262) *
             fVar80 + DAT_00551680._4_4_) * fVar47;
        auVar39._8_4_ =
             (float)(uVar15 & 0x3fc90fdb) +
             ((((fVar79 * -0.01606863 + -0.07504295) * fVar79 + -0.14203644) * fVar79 + -0.33333072)
              * fVar74 +
             (((fVar79 * 0.0028498897 + 0.04269152) * fVar79 + 0.10640934) * fVar79 + 0.1999262) *
             fVar79 + DAT_00551680._8_4_) * fVar35;
        auVar39._12_4_ =
             (float)(uVar16 & 0x3fc90fdb) +
             ((((fVar81 * -0.01606863 + -0.07504295) * fVar81 + -0.14203644) * fVar81 + -0.33333072)
              * fVar77 +
             (((fVar81 * 0.0028498897 + 0.04269152) * fVar81 + 0.10640934) * fVar81 + 0.1999262) *
             fVar81 + DAT_00551680._12_4_) * fVar49;
        auVar18._0_8_ = *(ulong *)*pauVar7 & 0x8000000080000000;
        auVar18._8_4_ = (uint)fVar17 & 0x80000000;
        auVar18._12_4_ = (uint)fVar36 & 0x80000000;
        *pauVar7 = auVar39 | auVar18;
        pauVar7 = pauVar7 + 1;
        lVar11 = lVar11 + 4;
      }
      lVar4 = sVar3 * sVar2 * uVar12;
      for (; (int)lVar11 < iVar8; lVar11 = lVar11 + 1) {
        fVar17 = atanf(*(float *)((long)pvVar1 + lVar11 * 4 + lVar4));
        *(float *)((long)pvVar1 + lVar11 * 4 + lVar4) = fVar17;
      }
    }
    break;
  case 0xf:
    iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar12 = 0;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar12;
    }
    for (; uVar12 != uVar5; uVar12 = uVar12 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar7 = (undefined1 (*) [16])(sVar3 * uVar12 * sVar2 + (long)pvVar1);
      lVar11 = 0;
      for (iVar10 = 0; iVar10 + 3 < iVar8; iVar10 = iVar10 + 4) {
        auVar55 = divps(auVar52,*pauVar7);
        *pauVar7 = auVar55;
        pauVar7 = pauVar7 + 1;
        lVar11 = lVar11 + 4;
      }
      lVar4 = sVar3 * sVar2 * uVar12;
      for (; (int)lVar11 < iVar8; lVar11 = lVar11 + 1) {
        *(float *)((long)pvVar1 + lVar11 * 4 + lVar4) =
             1.0 / *(float *)((long)pvVar1 + lVar11 * 4 + lVar4);
      }
    }
    break;
  case 0x10:
    iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar12 = 0;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar12;
    }
    for (; uVar12 != uVar5; uVar12 = uVar12 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar7 = (undefined1 (*) [16])(sVar3 * uVar12 * sVar2 + (long)pvVar1);
      lVar11 = 0;
      for (iVar10 = 0; iVar10 + 3 < iVar8; iVar10 = iVar10 + 4) {
        auVar51._0_4_ = *(float *)*pauVar7 * -2.0;
        auVar51._4_4_ = *(float *)((long)*pauVar7 + 4) * -2.0;
        auVar51._8_4_ = *(float *)((long)*pauVar7 + 8) * -2.0;
        auVar51._12_4_ = *(float *)((long)*pauVar7 + 0xc) * -2.0;
        auVar52 = minps(auVar51,_DAT_00551640);
        auVar52 = maxps(auVar52,_DAT_00551650);
        fVar35 = auVar52._0_4_ * 1.442695 + (float)DAT_00551670;
        fVar49 = auVar52._4_4_ * 1.442695 + DAT_00551670._4_4_;
        fVar48 = auVar52._8_4_ * 1.442695 + DAT_00551670._8_4_;
        fVar50 = auVar52._12_4_ * 1.442695 + DAT_00551670._12_4_;
        fVar17 = (float)(int)fVar35;
        fVar36 = (float)(int)fVar49;
        fVar28 = (float)(int)fVar48;
        fVar47 = (float)(int)fVar50;
        fVar74 = (float)DAT_00551680;
        fVar77 = DAT_00551680._4_4_;
        fVar78 = DAT_00551680._8_4_;
        fVar80 = DAT_00551680._12_4_;
        fVar17 = fVar17 - (float)(-(uint)(fVar35 < fVar17) & (uint)fVar74);
        fVar36 = fVar36 - (float)(-(uint)(fVar49 < fVar36) & (uint)fVar77);
        fVar28 = fVar28 - (float)(-(uint)(fVar48 < fVar28) & (uint)fVar78);
        fVar47 = fVar47 - (float)(-(uint)(fVar50 < fVar47) & (uint)fVar80);
        fVar35 = fVar17 * -0.6931472 + auVar52._0_4_;
        fVar49 = fVar36 * -0.6931472 + auVar52._4_4_;
        fVar48 = fVar28 * -0.6931472 + auVar52._8_4_;
        fVar50 = fVar47 * -0.6931472 + auVar52._12_4_;
        auVar45._0_4_ =
             (float)((int)fVar17 * 0x800000 + (int)fVar74) *
             (fVar35 + fVar74 +
             (((((fVar35 * 0.00019875691 + 0.0013981999) * fVar35 + 0.008333452) * fVar35 +
               0.041665796) * fVar35 + 0.16666666) * fVar35 + (float)DAT_00551670) * fVar35 * fVar35
             ) + fVar74;
        auVar45._4_4_ =
             (float)((int)fVar36 * 0x800000 + (int)fVar77) *
             (fVar49 + fVar77 +
             (((((fVar49 * 0.00019875691 + 0.0013981999) * fVar49 + 0.008333452) * fVar49 +
               0.041665796) * fVar49 + 0.16666666) * fVar49 + DAT_00551670._4_4_) * fVar49 * fVar49)
             + fVar77;
        auVar45._8_4_ =
             (float)((int)fVar28 * 0x800000 + (int)fVar78) *
             (fVar48 + fVar78 +
             (((((fVar48 * 0.00019875691 + 0.0013981999) * fVar48 + 0.008333452) * fVar48 +
               0.041665796) * fVar48 + 0.16666666) * fVar48 + DAT_00551670._8_4_) * fVar48 * fVar48)
             + fVar78;
        auVar45._12_4_ =
             (float)((int)fVar47 * 0x800000 + (int)fVar80) *
             (fVar50 + fVar80 +
             (((((fVar50 * 0.00019875691 + 0.0013981999) * fVar50 + 0.008333452) * fVar50 +
               0.041665796) * fVar50 + 0.16666666) * fVar50 + DAT_00551670._12_4_) * fVar50 * fVar50
             ) + fVar80;
        auVar52 = divps(_DAT_005520e0,auVar45);
        auVar38._0_4_ = auVar52._0_4_ + -1.0;
        auVar38._4_4_ = auVar52._4_4_ + -1.0;
        auVar38._8_4_ = auVar52._8_4_ + -1.0;
        auVar38._12_4_ = auVar52._12_4_ + -1.0;
        *pauVar7 = auVar38;
        pauVar7 = pauVar7 + 1;
        lVar11 = lVar11 + 4;
      }
      lVar4 = sVar3 * sVar2 * uVar12;
      for (; (int)lVar11 < iVar8; lVar11 = lVar11 + 1) {
        fVar17 = tanhf(*(float *)((long)pvVar1 + lVar11 * 4 + lVar4));
        *(float *)((long)pvVar1 + lVar11 * 4 + lVar4) = fVar17;
      }
    }
    break;
  case 0x11:
    iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar12 = 0;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar12;
    }
    for (; uVar12 != uVar5; uVar12 = uVar12 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar7 = (undefined1 (*) [16])(sVar3 * uVar12 * sVar2 + (long)pvVar1);
      lVar11 = 0;
      for (iVar10 = 0; iVar10 + 3 < iVar8; iVar10 = iVar10 + 4) {
        auVar52 = *pauVar7;
        auVar45 = maxps(auVar52,_DAT_005516f0);
        fVar17 = (float)(auVar45._0_4_ & 0x807fffff | 0x3f000000);
        fVar28 = (float)(auVar45._4_4_ & 0x807fffff | 0x3f000000);
        fVar35 = (float)(auVar45._8_4_ & 0x807fffff | 0x3f000000);
        fVar48 = (float)(auVar45._12_4_ & 0x807fffff | 0x3f000000);
        fVar36 = fVar17 + -1.0 + (float)(-(uint)(fVar17 < 0.70710677) & (uint)fVar17);
        fVar47 = fVar28 + -1.0 + (float)(-(uint)(fVar28 < 0.70710677) & (uint)fVar28);
        fVar49 = fVar35 + -1.0 + (float)(-(uint)(fVar35 < 0.70710677) & (uint)fVar35);
        fVar50 = fVar48 + -1.0 + (float)(-(uint)(fVar48 < 0.70710677) & (uint)fVar48);
        auVar55._4_4_ = -(uint)(auVar52._4_4_ <= 0.0);
        auVar55._0_4_ = -(uint)(auVar52._0_4_ <= 0.0);
        auVar55._8_4_ = -(uint)(auVar52._8_4_ <= 0.0);
        auVar55._12_4_ = -(uint)(auVar52._12_4_ <= 0.0);
        auVar57._0_4_ =
             (((float)(int)((auVar45._0_4_ >> 0x17) - 0x7e) -
              (float)(-(uint)(fVar17 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar36 +
             (((((((((fVar36 * 0.070376836 + -0.1151461) * fVar36 + 0.116769984) * fVar36 +
                   -0.12420141) * fVar36 + 0.14249323) * fVar36 + -0.16668057) * fVar36 + 0.20000714
                ) * fVar36 + -0.24999994) * fVar36 + 0.3333333) * fVar36 + -0.5) * fVar36 * fVar36)
             * 0.4342945;
        auVar57._4_4_ =
             (((float)(int)((auVar45._4_4_ >> 0x17) - 0x7e) -
              (float)(-(uint)(fVar28 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar47 +
             (((((((((fVar47 * 0.070376836 + -0.1151461) * fVar47 + 0.116769984) * fVar47 +
                   -0.12420141) * fVar47 + 0.14249323) * fVar47 + -0.16668057) * fVar47 + 0.20000714
                ) * fVar47 + -0.24999994) * fVar47 + 0.3333333) * fVar47 + -0.5) * fVar47 * fVar47)
             * 0.4342945;
        auVar57._8_4_ =
             (((float)(int)((auVar45._8_4_ >> 0x17) - 0x7e) -
              (float)(-(uint)(fVar35 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar49 +
             (((((((((fVar49 * 0.070376836 + -0.1151461) * fVar49 + 0.116769984) * fVar49 +
                   -0.12420141) * fVar49 + 0.14249323) * fVar49 + -0.16668057) * fVar49 + 0.20000714
                ) * fVar49 + -0.24999994) * fVar49 + 0.3333333) * fVar49 + -0.5) * fVar49 * fVar49)
             * 0.4342945;
        auVar57._12_4_ =
             (((float)(int)((auVar45._12_4_ >> 0x17) - 0x7e) -
              (float)(-(uint)(fVar48 < 0.70710677) & 0x3f800000)) * 0.6931472 + fVar50 +
             (((((((((fVar50 * 0.070376836 + -0.1151461) * fVar50 + 0.116769984) * fVar50 +
                   -0.12420141) * fVar50 + 0.14249323) * fVar50 + -0.16668057) * fVar50 + 0.20000714
                ) * fVar50 + -0.24999994) * fVar50 + 0.3333333) * fVar50 + -0.5) * fVar50 * fVar50)
             * 0.4342945;
        *pauVar7 = auVar57 | auVar55;
        pauVar7 = pauVar7 + 1;
        lVar11 = lVar11 + 4;
      }
      lVar4 = sVar3 * sVar2 * uVar12;
      for (; (int)lVar11 < iVar8; lVar11 = lVar11 + 1) {
        fVar17 = log10f(*(float *)((long)pvVar1 + lVar11 * 4 + lVar4));
        *(float *)((long)pvVar1 + lVar11 * 4 + lVar4) = fVar17;
      }
    }
    break;
  case 0x12:
    iVar8 = fegetround();
    uVar12 = 0;
    fesetround(0);
    iVar10 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d *
             bottom_top_blob->elempack;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar12;
    }
    for (; uVar12 != uVar5; uVar12 = uVar12 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pfVar6 = (float *)(sVar3 * uVar12 * sVar2 + (long)pvVar1);
      lVar11 = 0;
      for (iVar9 = 0; iVar9 + 3 < iVar10; iVar9 = iVar9 + 4) {
        *pfVar6 = (float)(int)*pfVar6;
        pfVar6[1] = (float)(int)pfVar6[1];
        pfVar6[2] = (float)(int)pfVar6[2];
        pfVar6[3] = (float)(int)pfVar6[3];
        pfVar6 = pfVar6 + 4;
        lVar11 = lVar11 + 4;
      }
      lVar4 = sVar3 * sVar2 * uVar12;
      for (; (int)lVar11 < iVar10; lVar11 = lVar11 + 1) {
        fVar17 = nearbyintf(*(float *)((long)pvVar1 + lVar11 * 4 + lVar4));
        *(float *)((long)pvVar1 + lVar11 * 4 + lVar4) = fVar17;
      }
    }
    fesetround(iVar8);
    break;
  case 0x13:
    iVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack
    ;
    uVar12 = 0;
    uVar5 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar5 = uVar12;
    }
    for (; uVar12 != uVar5; uVar12 = uVar12 + 1) {
      pvVar1 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->elemsize;
      sVar3 = bottom_top_blob->cstep;
      pauVar7 = (undefined1 (*) [16])(sVar3 * uVar12 * sVar2 + (long)pvVar1);
      lVar11 = 0;
      for (iVar10 = 0; iVar10 + 3 < iVar8; iVar10 = iVar10 + 4) {
        auVar52._0_4_ = (float)(int)*(float *)*pauVar7;
        auVar52._4_4_ = (float)(int)*(float *)((long)*pauVar7 + 4);
        auVar52._8_4_ = (float)(int)*(float *)((long)*pauVar7 + 8);
        auVar52._12_4_ = (float)(int)*(float *)((long)*pauVar7 + 0xc);
        *pauVar7 = auVar52;
        pauVar7 = pauVar7 + 1;
        lVar11 = lVar11 + 4;
      }
      lVar4 = sVar3 * sVar2 * uVar12;
      for (; (int)lVar11 < iVar8; lVar11 = lVar11 + 1) {
        fVar17 = truncf(*(float *)((long)pvVar1 + lVar11 * 4 + lVar4));
        *(float *)((long)pvVar1 + lVar11 * 4 + lVar4) = fVar17;
      }
    }
  }
  return 0;
}

Assistant:

int UnaryOp_x86::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    using namespace UnaryOp_x86_functor;
    if (op_type == Operation_ABS)
        return unary_op_inplace<unary_op_abs>(bottom_top_blob, opt);

    if (op_type == Operation_NEG)
        return unary_op_inplace<unary_op_neg>(bottom_top_blob, opt);

    if (op_type == Operation_FLOOR)
        return unary_op_inplace<unary_op_floor>(bottom_top_blob, opt);

    if (op_type == Operation_CEIL)
        return unary_op_inplace<unary_op_ceil>(bottom_top_blob, opt);

    if (op_type == Operation_SQUARE)
        return unary_op_inplace<unary_op_square>(bottom_top_blob, opt);

    if (op_type == Operation_SQRT)
        return unary_op_inplace<unary_op_sqrt>(bottom_top_blob, opt);

    if (op_type == Operation_RSQRT)
        return unary_op_inplace<unary_op_rsqrt>(bottom_top_blob, opt);

    if (op_type == Operation_EXP)
        return unary_op_inplace<unary_op_exp>(bottom_top_blob, opt);

    if (op_type == Operation_LOG)
        return unary_op_inplace<unary_op_log>(bottom_top_blob, opt);

    if (op_type == Operation_SIN)
        return unary_op_inplace<unary_op_sin>(bottom_top_blob, opt);

    if (op_type == Operation_COS)
        return unary_op_inplace<unary_op_cos>(bottom_top_blob, opt);

    if (op_type == Operation_TAN)
        return unary_op_inplace<unary_op_tan>(bottom_top_blob, opt);

    if (op_type == Operation_ASIN)
        return unary_op_inplace<unary_op_asin>(bottom_top_blob, opt);

    if (op_type == Operation_ACOS)
        return unary_op_inplace<unary_op_acos>(bottom_top_blob, opt);

    if (op_type == Operation_ATAN)
        return unary_op_inplace<unary_op_atan>(bottom_top_blob, opt);

    if (op_type == Operation_RECIPROCAL)
        return unary_op_inplace<unary_op_reciprocal>(bottom_top_blob, opt);

    if (op_type == Operation_TANH)
        return unary_op_inplace<unary_op_tanh>(bottom_top_blob, opt);

    if (op_type == Operation_LOG10)
        return unary_op_inplace<unary_op_log10>(bottom_top_blob, opt);

    if (op_type == Operation_ROUND)
    {
        // round to nearest even
#ifdef FE_TONEAREST
        int old_rm = fegetround();
        fesetround(FE_TONEAREST);
#endif
        int ret = unary_op_inplace<unary_op_round>(bottom_top_blob, opt);
#ifdef FE_TONEAREST
        fesetround(old_rm);
#endif
        return ret;
    }

    if (op_type == Operation_TRUNC)
        return unary_op_inplace<unary_op_trunc>(bottom_top_blob, opt);

    return 0;
}